

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_unbound_relationship *
mg_unbound_relationship_make(int64_t id,mg_string *type,mg_map *properties)

{
  mg_map *in_RDX;
  mg_string *in_RSI;
  int64_t in_RDI;
  mg_unbound_relationship *rel;
  size_t in_stack_ffffffffffffffd8;
  mg_unbound_relationship *local_8;
  
  local_8 = (mg_unbound_relationship *)
            mg_allocator_malloc((mg_allocator *)in_RDX,in_stack_ffffffffffffffd8);
  if (local_8 == (mg_unbound_relationship *)0x0) {
    local_8 = (mg_unbound_relationship *)0x0;
  }
  else {
    local_8->id = in_RDI;
    local_8->type = in_RSI;
    local_8->properties = in_RDX;
  }
  return local_8;
}

Assistant:

mg_unbound_relationship *mg_unbound_relationship_make(int64_t id,
                                                      mg_string *type,
                                                      mg_map *properties) {
  mg_unbound_relationship *rel = mg_allocator_malloc(
      &mg_system_allocator, sizeof(mg_unbound_relationship));
  if (!rel) {
    return NULL;
  }
  rel->id = id;
  rel->type = type;
  rel->properties = properties;
  return rel;
}